

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngineCommand.cpp
# Opt level: O2

unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_> __thiscall
(anonymous_namespace)::runAckermannBuild(int,int,int,std::__cxx11::string_const&,std::__cxx11::
string_const&)::AckermannDelegate::lookupRule(llbuild::core::KeyType_const__
          (void *this,KeyType *keyData)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Rule *this_00;
  KeyType *in_RDX;
  CommandSignature local_20;
  
  paVar1 = &(keyData->key).field_2;
  *(int *)paVar1 = *(int *)paVar1 + 1;
  this_00 = (Rule *)operator_new(0x30);
  local_20.value = 0;
  llbuild::core::Rule::Rule(this_00,in_RDX,&local_20);
  this_00->_vptr_Rule = (_func_int **)&PTR__Rule_00201330;
  *(Rule **)this = this_00;
  return (__uniq_ptr_data<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>,_true,_true>
         )(__uniq_ptr_data<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>,_true,_true>
           )this;
}

Assistant:

virtual std::unique_ptr<core::Rule> lookupRule(const core::KeyType& keyData) override {
      ++numRules;
      return std::unique_ptr<core::Rule>(new AckermannRule(keyData));
    }